

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

int Wlc_NtkMuxTree2(Gia_Man_t *pNew,int *pCtrl,int nCtrl,Vec_Int_t *vData,Vec_Int_t *vAnds,
                   Vec_Int_t *vTemp)

{
  int iVar1;
  int iLit1;
  int local_3c;
  int iLit;
  int m;
  Vec_Int_t *vTemp_local;
  Vec_Int_t *vAnds_local;
  Vec_Int_t *vData_local;
  int nCtrl_local;
  int *pCtrl_local;
  Gia_Man_t *pNew_local;
  
  if ((nCtrl != 0) && (iVar1 = Vec_IntSize(vData), iVar1 != 1 << ((byte)nCtrl & 0x1f))) {
    __assert_fail("!nCtrl || Vec_IntSize(vData) == (1 << nCtrl)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                  ,0x7f,
                  "int Wlc_NtkMuxTree2(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if ((nCtrl != 0) && (iVar1 = Vec_IntSize(vAnds), iVar1 != 1 << ((byte)nCtrl & 0x1f))) {
    __assert_fail("!nCtrl || Vec_IntSize(vAnds) == (1 << nCtrl)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                  ,0x80,
                  "int Wlc_NtkMuxTree2(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  Vec_IntClear(vTemp);
  for (local_3c = 0; iVar1 = Vec_IntSize(vAnds), local_3c < iVar1; local_3c = local_3c + 1) {
    iVar1 = Vec_IntEntry(vAnds,local_3c);
    iLit1 = Vec_IntEntry(vData,local_3c);
    iVar1 = Gia_ManHashAnd(pNew,iVar1,iLit1);
    iVar1 = Abc_LitNot(iVar1);
    Vec_IntPush(vTemp,iVar1);
  }
  iVar1 = Gia_ManHashAndMulti(pNew,vTemp);
  iVar1 = Abc_LitNot(iVar1);
  return iVar1;
}

Assistant:

int Wlc_NtkMuxTree2( Gia_Man_t * pNew, int * pCtrl, int nCtrl, Vec_Int_t * vData, Vec_Int_t * vAnds, Vec_Int_t * vTemp )
{
    int m, iLit;
    assert( !nCtrl || Vec_IntSize(vData) == (1 << nCtrl) );
    assert( !nCtrl || Vec_IntSize(vAnds) == (1 << nCtrl) );
    Vec_IntClear( vTemp );
    Vec_IntForEachEntry( vAnds, iLit, m )
        Vec_IntPush( vTemp, Abc_LitNot( Gia_ManHashAnd(pNew, iLit, Vec_IntEntry(vData, m)) ) );
    return Abc_LitNot( Gia_ManHashAndMulti(pNew, vTemp) );
}